

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int iVar3;
  int iVar6;
  Finder *pFVar4;
  size_t __n;
  OneofDescriptor *oneof_descriptor;
  undefined8 *puVar5;
  char *__n_00;
  pointer __n_01;
  int32_t number;
  size_type __n_02;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExtensionRange *pEVar12;
  undefined4 extraout_var_01;
  Descriptor *pDVar13;
  Descriptor *pDVar14;
  ReservedRange *pRVar15;
  FieldDescriptor *pFVar16;
  MessageFactory *factory;
  MessageLite *this_00;
  string *psVar17;
  Reflection *pRVar18;
  _Alloc_hider _Var19;
  ulong uVar20;
  ulong uVar21;
  string_view name;
  string_view name_00;
  string_view lowercase_name;
  string_view data;
  Metadata MVar22;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view printable_name;
  ParseLocationRange range;
  int32_t val;
  char *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  char local_208 [8];
  char *local_200;
  size_type local_1f8;
  pointer local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  Reflection *local_1d8;
  string field_name;
  undefined1 local_1a8 [48];
  string prefix_and_full_type_name;
  string full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  string serialized_value;
  string local_f0;
  string local_d0;
  string prefix;
  undefined1 local_80 [40];
  char *local_58;
  undefined4 extraout_var_02;
  
  MVar22 = Message::GetMetadata(message);
  local_1d8 = MVar22.reflection;
  MVar22 = Message::GetMetadata(message);
  pDVar14 = MVar22.descriptor;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  iVar3 = (this->tokenizer_).current_.line;
  iVar6 = (this->tokenizer_).current_.column;
  range.start.column = iVar6;
  range.start.line = iVar3;
  bVar8 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar8) {
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
    bVar8 = TryConsume(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    if (bVar8) {
      full_type_name._M_string_length = 0;
      full_type_name.field_2._M_local_buf[0] = '\0';
      prefix._M_string_length = 0;
      prefix.field_2._M_local_buf[0] = '\0';
      full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
      prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
      bVar8 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
      if (bVar8) {
        _val = (pointer)prefix._M_string_length;
        local_220 = prefix._M_dataplus._M_p;
        local_1a8._0_8_ = full_type_name._M_string_length;
        local_1a8._8_8_ = full_type_name._M_dataplus._M_p;
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)&prefix_and_full_type_name,(AlphaNum *)&val);
        _val = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
        bVar8 = ConsumeBeforeWhitespace(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_218) {
          operator_delete(_val,local_218._M_allocated_capacity + 1);
        }
        if (bVar8) {
          TryConsumeWhitespace(this);
          _val = (pointer)&local_218;
          std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
          bVar8 = TryConsumeBeforeWhitespace(this,(string *)&val);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val != &local_218) {
            operator_delete(_val,local_218._M_allocated_capacity + 1);
          }
          if (bVar8) {
            TryConsumeWhitespace(this);
          }
          paVar1 = &serialized_value.field_2;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          pFVar4 = this->finder_;
          serialized_value._M_dataplus._M_p = (pointer)paVar1;
          if (pFVar4 == (Finder *)0x0) {
            pDVar14 = anon_unknown_1::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
          }
          else {
            iVar11 = (*pFVar4->_vptr_Finder[4])(pFVar4,message,&prefix,&full_type_name);
            pDVar14 = (Descriptor *)CONCAT44(extraout_var,iVar11);
          }
          if (pDVar14 == (Descriptor *)0x0) {
            _val = (pointer)0x15;
            local_220 = "Could not find type \"";
            local_1a8._0_8_ = prefix_and_full_type_name._M_string_length;
            local_1a8._8_8_ = prefix_and_full_type_name._M_dataplus._M_p;
            local_80[0x20] = ' ';
            local_80[0x21] = '\0';
            local_80[0x22] = '\0';
            local_80[0x23] = '\0';
            local_80[0x24] = '\0';
            local_80[0x25] = '\0';
            local_80[0x26] = '\0';
            local_80[0x27] = '\0';
            local_58 = "\" stored in google.protobuf.Any.";
            absl::lts_20240722::StrCat_abi_cxx11_
                      ((AlphaNum *)local_80,(AlphaNum *)&val,(AlphaNum *)local_1a8);
            message_02._M_str = (char *)local_80._0_8_;
            message_02._M_len = local_80._8_8_;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_02);
            if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
              operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
            }
LAB_002fc959:
            bVar8 = false;
          }
          else {
            bVar8 = ConsumeAnyValue(this,pDVar14,&serialized_value);
            if (!bVar8) goto LAB_002fc959;
            if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
               (((bVar8 = FieldDescriptor::is_repeated(any_type_url_field), !bVar8 &&
                 (bVar8 = Reflection::HasField(local_1d8,message,any_type_url_field), bVar8)) ||
                ((bVar8 = FieldDescriptor::is_repeated(any_value_field), !bVar8 &&
                 (bVar8 = Reflection::HasField(local_1d8,message,any_value_field), bVar8)))))) {
              message_01._M_str = "Non-repeated Any specified multiple times.";
              message_01._M_len = 0x2a;
              ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                          message_01);
              goto LAB_002fc959;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prefix_and_full_type_name._M_dataplus._M_p == &prefix_and_full_type_name.field_2)
            {
              local_d0.field_2._8_8_ = prefix_and_full_type_name.field_2._8_8_;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0._M_dataplus._M_p = prefix_and_full_type_name._M_dataplus._M_p;
            }
            local_d0.field_2._M_allocated_capacity._1_7_ =
                 prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_;
            local_d0.field_2._M_local_buf[0] = prefix_and_full_type_name.field_2._M_local_buf[0];
            local_d0._M_string_length = prefix_and_full_type_name._M_string_length;
            prefix_and_full_type_name._M_string_length = 0;
            prefix_and_full_type_name.field_2._M_local_buf[0] = '\0';
            prefix_and_full_type_name._M_dataplus._M_p = (pointer)&prefix_and_full_type_name.field_2
            ;
            Reflection::SetString(local_1d8,message,any_type_url_field,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)serialized_value._M_dataplus._M_p == paVar1) {
              local_f0.field_2._8_8_ = serialized_value.field_2._8_8_;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            }
            else {
              local_f0._M_dataplus._M_p = serialized_value._M_dataplus._M_p;
            }
            local_f0.field_2._M_allocated_capacity._1_7_ =
                 serialized_value.field_2._M_allocated_capacity._1_7_;
            local_f0.field_2._M_local_buf[0] = serialized_value.field_2._M_local_buf[0];
            local_f0._M_string_length = serialized_value._M_string_length;
            serialized_value._M_string_length = 0;
            serialized_value.field_2._M_local_buf[0] = '\0';
            serialized_value._M_dataplus._M_p = (pointer)paVar1;
            Reflection::SetString(local_1d8,message,any_value_field,&local_f0);
            bVar8 = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)serialized_value._M_dataplus._M_p != paVar1) {
            operator_delete(serialized_value._M_dataplus._M_p,
                            CONCAT71(serialized_value.field_2._M_allocated_capacity._1_7_,
                                     serialized_value.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          bVar8 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
          operator_delete(prefix_and_full_type_name._M_dataplus._M_p,
                          CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                                   prefix_and_full_type_name.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar8 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prefix._M_dataplus._M_p != &prefix.field_2) {
        operator_delete(prefix._M_dataplus._M_p,
                        CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                                 prefix.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
        operator_delete(full_type_name._M_dataplus._M_p,
                        CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                                 full_type_name.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_002fd3dd;
    }
  }
  _val = (pointer)&local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
  bVar8 = TryConsume(this,(string *)&val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_val != &local_218) {
    operator_delete(_val,local_218._M_allocated_capacity + 1);
  }
  if (bVar8) {
    bVar8 = ConsumeFullTypeName(this,&field_name);
    if (bVar8) {
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar8 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (bVar8) {
        TryConsumeWhitespace(this);
        pFVar4 = this->finder_;
        if (pFVar4 == (Finder *)0x0) {
          MVar22 = Message::GetMetadata(message);
          printable_name._M_str = field_name._M_dataplus._M_p;
          printable_name._M_len = field_name._M_string_length;
          pFVar16 = DescriptorPool::FindExtensionByPrintableName
                              ((MVar22.descriptor)->file_->pool_,MVar22.descriptor,printable_name);
        }
        else {
          iVar11 = (*pFVar4->_vptr_Finder[2])(pFVar4,message,&field_name);
          pFVar16 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar11);
        }
        if (pFVar16 != (FieldDescriptor *)0x0) goto LAB_002fca64;
        if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
          local_1f0 = pDVar14->all_names_[1]._M_dataplus._M_p;
          local_1f8 = pDVar14->all_names_[1]._M_string_length;
          _val = (pointer)0x14;
          local_220 = "Ignoring extension \"";
          local_218._M_allocated_capacity = field_name._M_string_length;
          local_218._8_8_ = field_name._M_dataplus._M_p;
          local_208[0] = '2';
          local_208[1] = '\0';
          local_208[2] = '\0';
          local_208[3] = '\0';
          local_208[4] = '\0';
          local_208[5] = '\0';
          local_208[6] = '\0';
          local_208[7] = '\0';
          local_200 = "\" which is not defined or is not an extension of \"";
          local_1e8 = 2;
          local_1e0 = "\".";
          absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_1a8,&val,5);
          message_00._M_str = (char *)local_1a8._0_8_;
          message_00._M_len = local_1a8._8_8_;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_00);
          goto LAB_002fd145;
        }
        local_1f0 = pDVar14->all_names_[1]._M_dataplus._M_p;
        local_1f8 = pDVar14->all_names_[1]._M_string_length;
        _val = (pointer)0xb;
        local_220 = "Extension \"";
        local_218._M_allocated_capacity = field_name._M_string_length;
        local_218._8_8_ = field_name._M_dataplus._M_p;
        local_208[0] = ',';
        local_208[1] = '\0';
        local_208[2] = '\0';
        local_208[3] = '\0';
        local_208[4] = '\0';
        local_208[5] = '\0';
        local_208[6] = '\0';
        local_208[7] = '\0';
        local_200 = "\" is not defined or is not an extension of \"";
        local_1e8 = 2;
        local_1e0 = "\".";
        absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_1a8,&val,5);
        message_08._M_str = (char *)local_1a8._0_8_;
        message_08._M_len = local_1a8._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_08);
LAB_002fd3ba:
        _Var19._M_p = (pointer)local_1a8._0_8_;
        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) goto LAB_002fd3db;
LAB_002fd3d3:
        operator_delete(_Var19._M_p,local_1a8._16_8_ + 1);
      }
    }
    goto LAB_002fd3db;
  }
  bVar8 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
  if (!bVar8) goto LAB_002fd3db;
  TryConsumeWhitespace(this);
  if ((this->allow_field_number_ == true) &&
     (cVar9 = absl::lts_20240722::numbers_internal::safe_strto32_base
                        (field_name._M_string_length,field_name._M_dataplus._M_p,&val),
     _Var19._M_p = _val, cVar9 != '\0')) {
    number = val;
    pEVar12 = Descriptor::FindExtensionRangeContainingNumber(pDVar14,val);
    if (pEVar12 == (ExtensionRange *)0x0) {
      pRVar15 = Descriptor::FindReservedRangeContainingNumber(pDVar14,number);
      if (pRVar15 == (ReservedRange *)0x0) {
        pFVar16 = Descriptor::FindFieldByNumber(pDVar14,number);
        goto LAB_002fca58;
      }
    }
    else {
      pFVar4 = this->finder_;
      if (pFVar4 == (Finder *)0x0) {
        pFVar16 = DescriptorPool::FindExtensionByNumber(pDVar14->file_->pool_,pDVar14,number);
      }
      else {
        iVar11 = (*pFVar4->_vptr_Finder[3])(pFVar4,pDVar14,(ulong)_Var19._M_p & 0xffffffff);
        pFVar16 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar11);
      }
LAB_002fca58:
      if (pFVar16 != (FieldDescriptor *)0x0) goto LAB_002fca64;
LAB_002fd0a2:
      if (this->allow_unknown_field_ == false) {
        local_218._8_8_ = pDVar14->all_names_[1]._M_dataplus._M_p;
        local_218._M_allocated_capacity = pDVar14->all_names_[1]._M_string_length;
        _val = (pointer)0xe;
        local_220 = "Message type \"";
        local_208[0] = '\x16';
        local_208[1] = '\0';
        local_208[2] = '\0';
        local_208[3] = '\0';
        local_208[4] = '\0';
        local_208[5] = '\0';
        local_208[6] = '\0';
        local_208[7] = '\0';
        local_200 = "\" has no field named \"";
        local_1f8 = field_name._M_string_length;
        local_1f0 = field_name._M_dataplus._M_p;
        local_1e8 = 2;
        local_1e0 = "\".";
        absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_1a8,&val,5);
        message_07._M_str = (char *)local_1a8._0_8_;
        message_07._M_len = local_1a8._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_07);
        goto LAB_002fd3ba;
      }
      local_218._8_8_ = pDVar14->all_names_[1]._M_dataplus._M_p;
      local_218._M_allocated_capacity = pDVar14->all_names_[1]._M_string_length;
      _val = (pointer)0xe;
      local_220 = "Message type \"";
      local_208[0] = '\x16';
      local_208[1] = '\0';
      local_208[2] = '\0';
      local_208[3] = '\0';
      local_208[4] = '\0';
      local_208[5] = '\0';
      local_208[6] = '\0';
      local_208[7] = '\0';
      local_200 = "\" has no field named \"";
      local_1f8 = field_name._M_string_length;
      local_1f0 = field_name._M_dataplus._M_p;
      local_1e8 = 2;
      local_1e0 = "\".";
      absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_1a8,&val,5);
      message_06._M_str = (char *)local_1a8._0_8_;
      message_06._M_len = local_1a8._8_8_;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_06);
LAB_002fd145:
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((this->allow_unknown_field_ == false) && ((this->allow_unknown_extension_ & 1U) == 0)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&val,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                   ,0x281,0x42,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field")
        ;
        goto LAB_002fd717;
      }
    }
LAB_002fd17c:
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
    bVar8 = TryConsumeBeforeWhitespace(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    if (bVar8) {
      TryConsumeWhitespace(this);
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"{","");
      _Var19._M_p = _val;
      __n_00 = (char *)(this->tokenizer_).current_.text._M_string_length;
      if ((__n_00 == local_220) &&
         ((__n_00 == (char *)0x0 ||
          (iVar11 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,_val,(size_t)__n_00),
          iVar11 == 0)))) {
        bVar8 = false;
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"<","");
        uVar7 = local_1a8._0_8_;
        __n_01 = (pointer)(this->tokenizer_).current_.text._M_string_length;
        if (__n_01 == (pointer)local_1a8._8_8_) {
          if (__n_01 == (pointer)0x0) {
            bVar8 = false;
          }
          else {
            iVar11 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_1a8._0_8_,
                          (size_t)__n_01);
            bVar8 = iVar11 != 0;
          }
        }
        else {
          bVar8 = true;
        }
        _Var19._M_p = _val;
        if ((undefined1 *)uVar7 != local_1a8 + 0x10) {
          operator_delete((void *)uVar7,local_1a8._16_8_ + 1);
          _Var19._M_p = _val;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var19._M_p != &local_218) {
        operator_delete(_Var19._M_p,local_218._M_allocated_capacity + 1);
      }
      if (bVar8) {
        bVar8 = SkipFieldValue(this);
        goto LAB_002fd3dd;
      }
    }
    bVar8 = SkipFieldMessage(this);
    goto LAB_002fd3dd;
  }
  name._M_str = field_name._M_dataplus._M_p;
  name._M_len = field_name._M_string_length;
  pFVar16 = Descriptor::FindFieldByName(pDVar14,name);
  if (pFVar16 == (FieldDescriptor *)0x0) {
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&val,field_name._M_dataplus._M_p,
               field_name._M_dataplus._M_p + field_name._M_string_length);
    absl::lts_20240722::AsciiStrToLower((string *)&val);
    name_00._M_str = _val;
    name_00._M_len = (size_t)local_220;
    pFVar16 = Descriptor::FindFieldByName(pDVar14,name_00);
    if ((pFVar16 == (FieldDescriptor *)0x0) || (bVar8 = internal::cpp::IsGroupLike(pFVar16), !bVar8)
       ) {
LAB_002fc666:
      pFVar16 = (FieldDescriptor *)0x0;
    }
    else {
      pDVar13 = FieldDescriptor::message_type(pFVar16);
      __n = pDVar13->all_names_->_M_string_length;
      if ((__n != field_name._M_string_length) ||
         ((__n != 0 &&
          (iVar11 = bcmp((pDVar13->all_names_->_M_dataplus)._M_p,field_name._M_dataplus._M_p,__n),
          iVar11 != 0)))) goto LAB_002fc666;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    if (pFVar16 == (FieldDescriptor *)0x0) {
      if (this->allow_case_insensitive_field_ == true) {
        _val = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&val,field_name._M_dataplus._M_p,
                   field_name._M_dataplus._M_p + field_name._M_string_length);
        absl::lts_20240722::AsciiStrToLower((string *)&val);
        lowercase_name._M_str = _val;
        lowercase_name._M_len = (size_t)local_220;
        pFVar16 = Descriptor::FindFieldByLowercaseName(pDVar14,lowercase_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_218) {
          operator_delete(_val,local_218._M_allocated_capacity + 1);
        }
        if (pFVar16 != (FieldDescriptor *)0x0) goto LAB_002fca64;
      }
      __n_02 = field_name._M_string_length;
      _Var19._M_p = field_name._M_dataplus._M_p;
      uVar20 = (ulong)pDVar14->reserved_name_count_;
      if (0 < (long)uVar20) {
        pRVar18 = (Reflection *)pDVar14->reserved_names_;
        bVar8 = true;
        uVar21 = 1;
        local_1d8 = pRVar18;
        do {
          puVar5 = *(undefined8 **)((long)pRVar18 + uVar21 * 8 + -8);
          if ((puVar5[1] == __n_02) &&
             ((__n_02 == 0 ||
              (iVar11 = bcmp(_Var19._M_p,(void *)*puVar5,__n_02), pRVar18 = local_1d8, iVar11 == 0))
             )) break;
          bVar8 = uVar21 < uVar20;
          bVar10 = uVar21 != uVar20;
          uVar21 = uVar21 + 1;
        } while (bVar10);
        if (bVar8) goto LAB_002fd17c;
      }
      goto LAB_002fd0a2;
    }
  }
LAB_002fca64:
  if ((pFVar16->options_->field_0)._impl_.deprecated_ == true) {
    _val = (pointer)0x27;
    local_220 = "text format contains deprecated field \"";
    local_1a8._0_8_ = field_name._M_string_length;
    local_1a8._8_8_ = field_name._M_dataplus._M_p;
    local_80[0x20] = '\x01';
    local_80[0x21] = '\0';
    local_80[0x22] = '\0';
    local_80[0x23] = '\0';
    local_80[0x24] = '\0';
    local_80[0x25] = '\0';
    local_80[0x26] = '\0';
    local_80[0x27] = '\0';
    local_58 = "\"";
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)&full_type_name,(AlphaNum *)&val,(AlphaNum *)local_1a8);
    message_03._M_str = full_type_name._M_dataplus._M_p;
    message_03._M_len = full_type_name._M_string_length;
    ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  message_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
      operator_delete(full_type_name._M_dataplus._M_p,
                      CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                               full_type_name.field_2._M_local_buf[0]) + 1);
    }
  }
  if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
    bVar2 = pFVar16->field_0x1;
    bVar8 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar8) {
      psVar17 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                          (bVar8,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&val,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0xab7,*(undefined8 *)(psVar17 + 8),*(undefined8 *)psVar17);
      goto LAB_002fd717;
    }
    if ((bVar2 & 0x20) == 0) {
      bVar8 = Reflection::HasField(local_1d8,message,pFVar16);
      if (bVar8) {
        _val = (pointer)0x14;
        local_220 = "Non-repeated field \"";
        local_1a8._0_8_ = field_name._M_string_length;
        local_1a8._8_8_ = field_name._M_dataplus._M_p;
        local_80[0x20] = '\x1e';
        local_80[0x21] = '\0';
        local_80[0x22] = '\0';
        local_80[0x23] = '\0';
        local_80[0x24] = '\0';
        local_80[0x25] = '\0';
        local_80[0x26] = '\0';
        local_80[0x27] = '\0';
        local_58 = "\" is specified multiple times.";
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)&full_type_name,(AlphaNum *)&val,(AlphaNum *)local_1a8);
        message_04._M_str = full_type_name._M_dataplus._M_p;
        message_04._M_len = full_type_name._M_string_length;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_04);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
          local_1a8._16_8_ =
               CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                        full_type_name.field_2._M_local_buf[0]);
          _Var19 = full_type_name._M_dataplus;
          goto LAB_002fd3d3;
        }
        goto LAB_002fd3db;
      }
      bVar2 = pFVar16->field_0x1;
    }
    if ((bVar2 & 0x10) != 0) {
      oneof_descriptor = (pFVar16->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) {
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0xa9a);
      }
      bVar8 = Reflection::HasOneof(local_1d8,message,oneof_descriptor);
      if (bVar8) {
        pFVar16 = Reflection::GetOneofFieldDescriptor(local_1d8,message,oneof_descriptor);
        _val = (pointer)0x7;
        local_220 = "Field \"";
        local_1a8._0_8_ = field_name._M_string_length;
        local_1a8._8_8_ = field_name._M_dataplus._M_p;
        local_80[0x20] = '!';
        local_80[0x21] = '\0';
        local_80[0x22] = '\0';
        local_80[0x23] = '\0';
        local_80[0x24] = '\0';
        local_80[0x25] = '\0';
        local_80[0x26] = '\0';
        local_80[0x27] = '\0';
        local_58 = "\" is specified along with field \"";
        full_type_name._M_string_length = (size_type)(pFVar16->all_names_->_M_dataplus)._M_p;
        full_type_name._M_dataplus._M_p = (pointer)pFVar16->all_names_->_M_string_length;
        prefix._M_dataplus._M_p = (pointer)0x1c;
        prefix._M_string_length = (size_type)anon_var_dwarf_a63c95;
        absl::lts_20240722::StrCat<std::__cxx11::string,char[3]>
                  (&prefix_and_full_type_name,(lts_20240722 *)&val,(AlphaNum *)local_1a8,
                   (AlphaNum *)(local_80 + 0x20),(AlphaNum *)&full_type_name,(AlphaNum *)&prefix,
                   (AlphaNum *)oneof_descriptor->all_names_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x373515,
                   (char (*) [3])0x7);
        message_05._M_str = prefix_and_full_type_name._M_dataplus._M_p;
        message_05._M_len = prefix_and_full_type_name._M_string_length;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_05);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
          local_1a8._16_8_ =
               CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                        prefix_and_full_type_name.field_2._M_local_buf[0]);
          _Var19 = prefix_and_full_type_name._M_dataplus;
          goto LAB_002fd3d3;
        }
        goto LAB_002fd3db;
      }
    }
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar16->type_ * 4) == 10) {
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
    bVar8 = TryConsumeBeforeWhitespace(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    if (((bVar8) && (TryConsumeWhitespace(this), (pFVar16->options_->field_0)._impl_.weak_ == true))
       && ((this->tokenizer_).current_.type == TYPE_STRING)) {
      _val = (pointer)&local_218;
      local_220 = (char *)0x0;
      local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
      bVar8 = ConsumeString(this,(string *)&val);
      if (bVar8) {
        pFVar4 = this->finder_;
        if (pFVar4 == (Finder *)0x0) {
          factory = (MessageFactory *)0x0;
        }
        else {
          iVar11 = (*pFVar4->_vptr_Finder[5])(pFVar4,pFVar16);
          factory = (MessageFactory *)CONCAT44(extraout_var_02,iVar11);
        }
        this_00 = &Reflection::MutableMessage(local_1d8,message,pFVar16,factory)->super_MessageLite;
        data._M_str = _val;
        data._M_len = (size_t)local_220;
        MessageLite::ParseFromString(this_00,data);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (!bVar8) goto LAB_002fd3db;
    }
    else {
LAB_002fce26:
      bVar2 = pFVar16->field_0x1;
      bVar8 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 != bVar8) {
        psVar17 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                            (bVar8,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&val,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0xab7,*(undefined8 *)(psVar17 + 8),*(undefined8 *)psVar17);
LAB_002fd717:
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val)
        ;
      }
      if ((bVar2 & 0x20) != 0) {
        _val = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
        bVar8 = TryConsume(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_218) {
          operator_delete(_val,local_218._M_allocated_capacity + 1);
        }
        if (bVar8) {
          _val = (pointer)&local_218;
          std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
          bVar8 = TryConsume(this,(string *)&val);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val != &local_218) {
            operator_delete(_val,local_218._M_allocated_capacity + 1);
          }
          if (!bVar8) {
            do {
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar16->type_ * 4) == 10) {
                bVar8 = ConsumeFieldMessage(this,message,local_1d8,pFVar16);
              }
              else {
                bVar8 = ConsumeFieldValue(this,message,local_1d8,pFVar16);
              }
              if (bVar8 == false) goto LAB_002fd3db;
              _val = (pointer)&local_218;
              std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
              bVar8 = TryConsume(this,(string *)&val);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_val != &local_218) {
                operator_delete(_val,local_218._M_allocated_capacity + 1);
              }
              if (bVar8) goto LAB_002fd565;
              _val = (pointer)&local_218;
              std::__cxx11::string::_M_construct<char_const*>((string *)&val,",","");
              bVar10 = Consume(this,(string *)&val);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_val != &local_218) {
                operator_delete(_val,local_218._M_allocated_capacity + 1);
              }
              bVar8 = false;
            } while (bVar10);
            goto LAB_002fd3dd;
          }
          goto LAB_002fd565;
        }
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar16->type_ * 4) == 10) {
        bVar8 = ConsumeFieldMessage(this,message,local_1d8,pFVar16);
      }
      else {
        bVar8 = ConsumeFieldValue(this,message,local_1d8,pFVar16);
      }
      if (bVar8 == false) goto LAB_002fd3db;
    }
LAB_002fd565:
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,";","");
    bVar8 = TryConsume(this,(string *)&val);
    if (!bVar8) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,",","");
      TryConsume(this,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    bVar8 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      range.end.column = (this->tokenizer_).previous_.end_column;
      range.end.line = (this->tokenizer_).previous_.line;
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar16,range);
    }
  }
  else {
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
    bVar8 = ConsumeBeforeWhitespace(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    if (bVar8) {
      TryConsumeWhitespace(this);
      goto LAB_002fce26;
    }
LAB_002fd3db:
    bVar8 = false;
  }
LAB_002fd3dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p,
                    CONCAT71(field_name.field_2._M_allocated_capacity._1_7_,
                             field_name.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }